

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuples.h
# Opt level: O2

void __thiscall
chrono::
ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
::Build_CqT(ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
            *this,ChSparseMatrix *storage,int inscol)

{
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Build_CqT
            (&this->tuple_a,storage,inscol);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Build_CqT
            (&this->tuple_b,storage,inscol);
  return;
}

Assistant:

virtual void Build_CqT(ChSparseMatrix& storage, int inscol) override {
        tuple_a.Build_CqT(storage, inscol);
        tuple_b.Build_CqT(storage, inscol);
    }